

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

vector<duckdb::BoundOrderByNode,_true> * __thiscall
duckdb::Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::BoundOrderByNode,true>>
          (vector<duckdb::BoundOrderByNode,_true> *__return_storage_ptr__,Deserializer *this,
          field_id_t field_id,char *tag)

{
  int iVar1;
  undefined6 in_register_00000012;
  vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> local_28;
  
  iVar1 = (*this->_vptr_Deserializer[4])
                    (this,CONCAT62(in_register_00000012,field_id) & 0xffffffff,tag);
  if ((char)iVar1 == '\0') {
    (*this->_vptr_Deserializer[5])(this,0);
    (__return_storage_ptr__->
    super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
    super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
    super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
    super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_28.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_28.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_28.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::~vector
              (&local_28);
  }
  else {
    Read<duckdb::vector<duckdb::BoundOrderByNode,true>>(__return_storage_ptr__,this);
    (*this->_vptr_Deserializer[5])(this,1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline T ReadPropertyWithDefault(const field_id_t field_id, const char *tag) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return std::forward<T>(SerializationDefaultValue::GetDefault<T>());
		}
		auto ret = Read<T>();
		OnOptionalPropertyEnd(true);
		return ret;
	}